

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O3

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ellipses::cleanup_center_points
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *points,Mat *img,bool debug)

{
  double dVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  undefined7 in_register_00000009;
  pointer pPVar5;
  int iVar6;
  iterator __first;
  ulong uVar7;
  pointer pPVar8;
  int iVar9;
  pointer pPVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  initializer_list<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_> __l;
  allocator_type local_159;
  undefined1 local_158 [8];
  Size2f SStack_150;
  Size local_148;
  undefined8 uStack_140;
  _InputArray local_138;
  undefined4 local_11c;
  RotatedRect local_118;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_100;
  Mat *local_f8;
  undefined8 local_f0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_e8;
  undefined4 local_d0 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_c8;
  undefined8 local_c0;
  int local_b8;
  undefined4 uStack_b4;
  float fStack_b0;
  float fStack_ac;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_a8;
  Mat tmp;
  
  local_11c = (undefined4)CONCAT71(in_register_00000009,debug);
  local_118.center.x = 0.0;
  local_118.center.y = 0.0;
  local_118.size.width = 0.0;
  local_118.size.height = 0.0;
  local_118.angle = 0.0;
  local_b8 = 0;
  uStack_b4 = 0;
  fStack_b0 = 0.0;
  fStack_ac = 3.7480469;
  uVar13 = 0;
  local_100 = __return_storage_ptr__;
  local_f8 = img;
  do {
    pPVar8 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pPVar5 - (long)pPVar8) < 0x29) goto LAB_001124dc;
    _tmp = 0x8103000c;
    cv::fitEllipse((_InputArray *)local_158);
    local_118.center.x = local_158._0_4_;
    local_118.center.y = (float)local_158._4_4_;
    local_118.size = SStack_150;
    local_118.angle = (float)local_148.width;
    fVar14 = SStack_150.width;
    if ((char)local_11c != '\0') {
      cv::Mat::clone();
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x3010000;
      local_138.obj = &tmp;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_e8,points);
      __l._M_len = 1;
      __l._M_array = &local_e8;
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::vector(&local_a8,__l,&local_159);
      local_c0 = 0;
      local_d0[0] = 0x8104000c;
      local_158 = (undefined1  [8])0x406fe00000000000;
      uStack_140 = 0;
      SStack_150 = (Size2f)0x0;
      local_148.width = 0;
      local_148.height = 0;
      local_c8 = &local_a8;
      uVar2 = cv::noArray();
      local_f0 = 0;
      cv::drawContours(&local_138,local_d0,0,local_158,3,8,uVar2,0x7fffffff,&local_f0);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::~vector(&local_a8);
      if (local_e8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x3010000;
      local_138.obj = &tmp;
      local_158._4_4_ = uStack_b4;
      local_158._0_4_ = local_b8;
      SStack_150.height = fStack_ac;
      SStack_150.width = fStack_b0;
      local_148.width = 0;
      local_148.height = 0;
      uStack_140 = 0;
      cv::ellipse((_InputOutputArray *)&local_138,&local_118,(Scalar_ *)local_158,3,8);
      local_158 = (undefined1  [8])&local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Cleanup","");
      cv::namedWindow((string *)local_158,0);
      if (local_158 != (undefined1  [8])&local_148) {
        operator_delete((void *)local_158,(long)local_148 + 1);
      }
      local_158 = (undefined1  [8])&local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Cleanup","");
      local_138.sz.width = 0;
      local_138.sz.height = 0;
      local_138.flags = 0x1010000;
      local_138.obj = &tmp;
      cv::imshow((string *)local_158,&local_138);
      if (local_158 != (undefined1  [8])&local_148) {
        operator_delete((void *)local_158,(long)local_148 + 1);
      }
      cv::waitKey(0);
      cv::destroyAllWindows();
      cv::Mat::~Mat(&tmp);
      fVar14 = local_118.size.width;
    }
    uVar7 = 8;
    if (uVar13 < 8) {
      uVar7 = uVar13;
    }
    dVar15 = ((double)(long)uVar7 * 0.03 + 0.24) * (double)fVar14;
    dVar1 = ((double)(long)uVar7 * -0.03 + 0.82) * (double)fVar14;
    iVar4 = (int)ROUND(local_118.center.x);
    iVar9 = (int)ROUND(local_118.center.y);
    pPVar8 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)pPVar5 - (long)pPVar8;
    uVar7 = uVar3;
    pPVar10 = pPVar8;
    if (0 < (long)uVar3 >> 5) {
      pPVar10 = (pointer)((long)&pPVar8->x + (uVar3 & 0xffffffffffffffe0));
      lVar11 = ((long)uVar3 >> 5) + 1;
      __first._M_current = pPVar8 + 2;
      do {
        iVar12 = __first._M_current[-2].x - iVar4;
        iVar6 = __first._M_current[-2].y - iVar9;
        dVar16 = SQRT((double)(iVar6 * iVar6 + iVar12 * iVar12));
        if ((dVar16 < dVar15) || (dVar1 < dVar16)) {
          __first._M_current = __first._M_current + -2;
          goto LAB_00112458;
        }
        iVar12 = __first._M_current[-1].x - iVar4;
        iVar6 = __first._M_current[-1].y - iVar9;
        dVar16 = SQRT((double)(iVar6 * iVar6 + iVar12 * iVar12));
        if ((dVar16 < dVar15) || (dVar1 < dVar16)) {
          __first._M_current = __first._M_current + -1;
          goto LAB_00112458;
        }
        iVar12 = (__first._M_current)->x - iVar4;
        iVar6 = (__first._M_current)->y - iVar9;
        dVar16 = SQRT((double)(iVar6 * iVar6 + iVar12 * iVar12));
        if ((dVar16 < dVar15) || (dVar1 < dVar16)) goto LAB_00112458;
        iVar12 = __first._M_current[1].x - iVar4;
        iVar6 = __first._M_current[1].y - iVar9;
        dVar16 = SQRT((double)(iVar6 * iVar6 + iVar12 * iVar12));
        if ((dVar16 < dVar15) || (dVar1 < dVar16)) {
          __first._M_current = __first._M_current + 1;
          goto LAB_00112458;
        }
        lVar11 = lVar11 + -1;
        __first._M_current = __first._M_current + 4;
      } while (1 < lVar11);
      uVar7 = (long)pPVar5 - (long)pPVar10;
    }
    lVar11 = (long)uVar7 >> 3;
    if (lVar11 == 1) {
LAB_001123fe:
      iVar6 = pPVar10->x - iVar4;
      iVar12 = pPVar10->y - iVar9;
      dVar16 = SQRT((double)(iVar12 * iVar12 + iVar6 * iVar6));
      __first._M_current = pPVar10;
      if (dVar16 <= dVar1 && dVar15 <= dVar16) {
        __first._M_current = pPVar5;
      }
LAB_00112458:
      pPVar10 = __first._M_current + 1;
      if (pPVar10 != pPVar5 && __first._M_current != pPVar5) {
        do {
          iVar6 = pPVar10->x - iVar4;
          iVar12 = pPVar10->y - iVar9;
          dVar16 = SQRT((double)(iVar12 * iVar12 + iVar6 * iVar6));
          if ((dVar15 <= dVar16) && (dVar16 <= dVar1)) {
            (__first._M_current)->x = pPVar10->x;
            (__first._M_current)->y = pPVar10->y;
            __first._M_current = __first._M_current + 1;
          }
          pPVar10 = pPVar10 + 1;
        } while (pPVar10 != pPVar5);
      }
    }
    else {
      if (lVar11 == 2) {
LAB_001123cc:
        iVar6 = pPVar10->x - iVar4;
        iVar12 = pPVar10->y - iVar9;
        dVar16 = SQRT((double)(iVar12 * iVar12 + iVar6 * iVar6));
        __first._M_current = pPVar10;
        if ((dVar15 <= dVar16) && (dVar16 <= dVar1)) {
          pPVar10 = pPVar10 + 1;
          goto LAB_001123fe;
        }
        goto LAB_00112458;
      }
      __first._M_current = pPVar5;
      if (lVar11 == 3) {
        iVar6 = pPVar10->x - iVar4;
        iVar12 = pPVar10->y - iVar9;
        dVar16 = SQRT((double)(iVar12 * iVar12 + iVar6 * iVar6));
        __first._M_current = pPVar10;
        if ((dVar15 <= dVar16) && (dVar16 <= dVar1)) {
          pPVar10 = pPVar10 + 1;
          goto LAB_001123cc;
        }
        goto LAB_00112458;
      }
    }
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_erase
              (points,__first,(Point_<int> *)((long)pPVar8 + uVar3));
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0xc);
  pPVar8 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar5 = (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
LAB_001124dc:
  (local_100->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = pPVar8;
  (local_100->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = pPVar5;
  (local_100->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (points->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_100;
}

Assistant:

std::vector<cv::Point> cleanup_center_points(std::vector<cv::Point> points, const cv::Mat& img, bool debug)
{
    std::ptrdiff_t erase_count = 0;
    cv::RotatedRect ellipse;
    std::size_t iteration = 0;
    const constexpr std::size_t max_iteration = 8;
    const constexpr double step = 0.03;
    const constexpr double lower_start = 0.48 - (step * double(max_iteration));
    const constexpr double upper_start = 0.58 + (step * double(max_iteration));
    while(iteration < 12 && points.size() > 5)
    {
        ellipse = cv::fitEllipse(points);

        if(debug)
        {
            auto tmp = img.clone();
            cv::drawContours(tmp, std::vector<std::vector<cv::Point>> {points}, 0, cv::Scalar(255, 0, 0), 3);
            cv::ellipse(tmp, ellipse, cv::Scalar(0, 255, 0), 3);
            cv::namedWindow("Cleanup", cv::WINDOW_NORMAL);
            cv::imshow("Cleanup", tmp);
            cv::waitKey(0);
            cv::destroyAllWindows();
        }

        auto lower_threshold = ellipse.size.width * (lower_start + step * std::min(iteration, max_iteration));
        auto upper_threshold = ellipse.size.width * (upper_start - step * std::min(iteration, max_iteration));

        cv::Point center = ellipse.center;

        auto it = std::remove_if(
            points.begin(), points.end(), [center, lower_threshold, upper_threshold](const cv::Point& p) {
                auto dis = euclideanDistance(p, center);
                return dis < lower_threshold || dis > upper_threshold;
            });
        erase_count = std::distance(it, points.end());
        points.erase(it, points.end());
        iteration++;
    }
    return points;
}